

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

recv_result_t __thiscall
zmq::detail::recv_multipart_n<true,zmq::message_t*>
          (detail *this,socket_ref s,message_t *out,size_t n,recv_flags flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  runtime_error *this_00;
  ulong extraout_RDX;
  _Storage<unsigned_long,_true> _Var9;
  void *__buf;
  undefined8 uVar10;
  recv_result_t rVar11;
  message_t msg;
  socket_ref s_local;
  
  __buf = (void *)(n & 0xffffffff);
  s_local.super_socket_base._handle = (socket_base)(socket_base)this;
  message_t::message_t(&msg);
  _Var9._M_value = 0;
  while( true ) {
    if (out == (message_t *)_Var9._M_value) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Too many message parts in recv_multipart_n");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    socket_base::recv(&s_local.super_socket_base,(int)&msg,__buf,n,flags);
    if ((extraout_RDX & 1) == 0) break;
    _Var9._M_value = _Var9._M_value + 1;
    bVar8 = message_t::more(&msg);
    uVar10 = *(undefined8 *)s.super_socket_base._handle;
    uVar1 = *(undefined8 *)((long)s.super_socket_base._handle + 8);
    uVar2 = *(undefined8 *)((long)s.super_socket_base._handle + 0x10);
    uVar3 = *(undefined8 *)((long)s.super_socket_base._handle + 0x18);
    uVar4 = *(undefined8 *)((long)s.super_socket_base._handle + 0x20);
    uVar5 = *(undefined8 *)((long)s.super_socket_base._handle + 0x28);
    uVar6 = *(undefined8 *)((long)s.super_socket_base._handle + 0x30);
    uVar7 = *(undefined8 *)((long)s.super_socket_base._handle + 0x38);
    *(undefined8 *)((long)s.super_socket_base._handle + 0x30) = msg.msg._._48_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x38) = msg.msg._._56_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x20) = msg.msg._._32_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x28) = msg.msg._._40_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x10) = msg.msg._._16_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x18) = msg.msg._._24_8_;
    *(undefined8 *)s.super_socket_base._handle = msg.msg._._0_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 8) = msg.msg._._8_8_;
    s.super_socket_base._handle = (socket_base)((long)s.super_socket_base._handle + 0x40);
    msg.msg._._0_8_ = uVar10;
    msg.msg._._8_8_ = uVar1;
    msg.msg._._16_8_ = uVar2;
    msg.msg._._24_8_ = uVar3;
    msg.msg._._32_8_ = uVar4;
    msg.msg._._40_8_ = uVar5;
    msg.msg._._48_8_ = uVar6;
    msg.msg._._56_8_ = uVar7;
    if (!bVar8) {
      uVar10 = CONCAT71((int7)((ulong)__buf >> 8),1);
LAB_0013f675:
      message_t::~message_t(&msg);
      rVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar10;
      rVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var9._M_value;
      return (recv_result_t)
             rVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
  }
  if ((uchar *)_Var9._M_value != (uchar *)0x0) {
    __assert_fail("msg_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp",
                  0x75,
                  "recv_result_t zmq::detail::recv_multipart_n(socket_ref, OutputIt, size_t, recv_flags) [CheckN = true, OutputIt = zmq::message_t *]"
                 );
  }
  uVar10 = 0;
  _Var9._M_value = 0;
  goto LAB_0013f675;
}

Assistant:

recv_result_t
recv_multipart_n(socket_ref s, OutputIt out, size_t n, recv_flags flags)
{
    size_t msg_count = 0;
    message_t msg;
    while (true) {
        if ZMQ_CONSTEXPR_IF (CheckN) {
            if (msg_count >= n)
                throw std::runtime_error(
                  "Too many message parts in recv_multipart_n");
        }
        if (!s.recv(msg, flags)) {
            // zmq ensures atomic delivery of messages
            assert(msg_count == 0);
            return {};
        }
        ++msg_count;
        const bool more = msg.more();
        *out++ = std::move(msg);
        if (!more)
            break;
    }
    return msg_count;
}